

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode Curl_cf_unix_create(Curl_cfilter **pcf,Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,
                            int transport)

{
  CURLcode CVar1;
  cf_socket_ctx *ctx;
  Curl_cfilter *pCVar2;
  Curl_cfilter *cf;
  
  cf = (Curl_cfilter *)0x0;
  ctx = (cf_socket_ctx *)(*Curl_ccalloc)(1,0x138);
  if (ctx == (cf_socket_ctx *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar1 = cf_socket_ctx_init(ctx,ai,transport);
    if (CVar1 == CURLE_OK) {
      CVar1 = Curl_cf_create(&cf,&Curl_cft_unix,ctx);
      pCVar2 = (Curl_cfilter *)0x0;
      if (CVar1 == CURLE_OK) {
        pCVar2 = cf;
      }
      *pcf = pCVar2;
      pCVar2 = cf;
      if (CVar1 == CURLE_OK) {
        return CURLE_OK;
      }
      goto LAB_00116a6e;
    }
  }
  *pcf = (Curl_cfilter *)0x0;
  pCVar2 = (Curl_cfilter *)0x0;
LAB_00116a6e:
  (*Curl_cfree)(pCVar2);
  cf = (Curl_cfilter *)0x0;
  (*Curl_cfree)(ctx);
  return CVar1;
}

Assistant:

CURLcode Curl_cf_unix_create(struct Curl_cfilter **pcf,
                             struct Curl_easy *data,
                             struct connectdata *conn,
                             const struct Curl_addrinfo *ai,
                             int transport)
{
  struct cf_socket_ctx *ctx = NULL;
  struct Curl_cfilter *cf = NULL;
  CURLcode result;

  (void)data;
  (void)conn;
  DEBUGASSERT(transport == TRNSPRT_UNIX);
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = cf_socket_ctx_init(ctx, ai, transport);
  if(result)
    goto out;

  result = Curl_cf_create(&cf, &Curl_cft_unix, ctx);

out:
  *pcf = (!result) ? cf : NULL;
  if(result) {
    Curl_safefree(cf);
    Curl_safefree(ctx);
  }

  return result;
}